

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O2

void __thiscall
irr::scene::CBillboardSceneNode::updateMesh(CBillboardSceneNode *this,ICameraSceneNode *camera)

{
  SMeshBuffer *pSVar1;
  pointer pSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  float extraout_XMM0_Da;
  float fVar5;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  float fVar6;
  float fVar7;
  vector3d<float> vVar8;
  vector3d<float> local_a8;
  float local_9c;
  vector3d<float> local_98;
  vector3d<float> local_88;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  undefined1 local_58 [16];
  vector3d<float> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = (**(code **)(*(long *)((long)&this->_vptr_CBillboardSceneNode +
                                   (long)this->_vptr_CBillboardSceneNode[-3]) + 0xe8))
                       ((_func_int *)
                        ((long)&this->_vptr_CBillboardSceneNode +
                        (long)this->_vptr_CBillboardSceneNode[-3]));
  local_9c = in_XMM1_Da;
  (*(camera->super_ISceneNode)._vptr_ISceneNode[0x1d])(camera);
  local_58._0_4_ = in_XMM1_Da;
  local_68 = extraout_XMM0_Da;
  fStack_64 = extraout_XMM0_Db;
  iVar3 = (*(camera->super_ISceneNode)._vptr_ISceneNode[0x2b])(camera);
  local_78._0_4_ = *(undefined4 *)((undefined8 *)CONCAT44(extraout_var,iVar3) + 1);
  local_38 = *(undefined8 *)CONCAT44(extraout_var,iVar3);
  uStack_30 = 0;
  iVar3 = (*(camera->super_ISceneNode)._vptr_ISceneNode[0x2d])(camera);
  local_48._0_8_ = *(undefined8 *)CONCAT44(extraout_var_00,iVar3);
  local_48.Z = *(float *)((undefined8 *)CONCAT44(extraout_var_00,iVar3) + 1);
  local_88.X = (float)local_38 - local_68;
  local_88.Y = local_38._4_4_ - fStack_64;
  local_88.Z = (float)local_78._0_4_ - (float)local_58._0_4_;
  core::vector3d<float>::normalize(&local_88);
  vVar8 = core::vector3d<float>::crossProduct(&local_48,&local_88);
  local_a8.Z = vVar8.Z;
  local_a8._0_8_ = vVar8._0_8_;
  fVar5 = SQRT(local_a8.Z * local_a8.Z + vVar8.X * vVar8.X + vVar8.Y * vVar8.Y);
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    local_a8.Y = local_48.X;
    local_a8.X = local_48.Y;
    local_a8.Z = local_48.Z;
  }
  core::vector3d<float>::normalize(&local_a8);
  fVar6 = local_a8.Y;
  local_58 = ZEXT416((uint)this->TopEdgeWidth);
  fVar5 = (this->Size).Width * 0.5;
  local_68 = local_a8.Z;
  local_a8.Z = local_a8.Z * fVar5;
  local_78._0_4_ = local_a8.X;
  local_78._4_4_ = local_a8.Y;
  local_78._8_8_ = 0;
  local_a8.X = fVar5 * local_a8.X;
  local_a8.Y = fVar5 * fVar6;
  vVar8 = core::vector3d<float>::crossProduct(&local_a8,&local_88);
  local_98.Z = vVar8.Z;
  local_98._0_8_ = vVar8._0_8_;
  core::vector3d<float>::normalize(&local_98);
  fVar6 = (this->Size).Height * 0.5;
  fVar5 = local_98.Y;
  local_98.X = fVar6 * local_98.X;
  local_98.Y = fVar6 * fVar5;
  local_98.Z = fVar6 * local_98.Z;
  local_88._0_8_ = CONCAT44(local_88.Y,local_88.X) ^ 0x8000000080000000;
  local_88.Z = -local_88.Z;
  pSVar1 = this->Buffer;
  for (lVar4 = 0xc; lVar4 != 0x9c; lVar4 = lVar4 + 0x24) {
    pSVar2 = (pSVar1->Vertices).m_data.
             super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(float *)((long)&(pSVar2->Pos).Z + lVar4) = local_88.Z;
    *(undefined8 *)((long)&(pSVar2->Pos).X + lVar4) = local_88._0_8_;
  }
  fVar7 = local_68 * 0.5 * (float)local_58._0_4_;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  (pSVar2->Pos).X = local_98.X + local_a8.X + (float)local_28;
  (pSVar2->Pos).Y = local_98.Y + local_a8.Y + local_28._4_4_;
  (pSVar2->Pos).Z = local_a8.Z + local_9c + local_98.Z;
  fVar5 = (float)local_58._0_4_ * (float)local_78._0_4_ * 0.5;
  fVar6 = (float)local_58._0_4_ * (float)local_78._4_4_ * 0.5;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[1].Pos.X = ((float)local_28 + fVar5) - local_98.X;
  pSVar2[1].Pos.Y = (local_28._4_4_ + fVar6) - local_98.Y;
  pSVar2[1].Pos.Z = (local_9c + fVar7) - local_98.Z;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[2].Pos.X = ((float)local_28 - fVar5) - local_98.X;
  pSVar2[2].Pos.Y = (local_28._4_4_ - fVar6) - local_98.Y;
  pSVar2[2].Pos.Z = (local_9c - fVar7) - local_98.Z;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[3].Pos.X = ((float)local_28 - local_a8.X) + local_98.X;
  pSVar2[3].Pos.Y = (local_28._4_4_ - local_a8.Y) + local_98.Y;
  pSVar2[3].Pos.Z = (local_9c - local_a8.Z) + local_98.Z;
  (*(this->Buffer->super_IMeshBuffer)._vptr_IMeshBuffer[0x17])(this->Buffer,1);
  (*(this->Buffer->super_IMeshBuffer)._vptr_IMeshBuffer[0xc])();
  return;
}

Assistant:

void CBillboardSceneNode::updateMesh(const irr::scene::ICameraSceneNode *camera)
{
	// billboard looks toward camera
	core::vector3df pos = getAbsolutePosition();

	core::vector3df campos = camera->getAbsolutePosition();
	core::vector3df target = camera->getTarget();
	core::vector3df up = camera->getUpVector();
	core::vector3df view = target - campos;
	view.normalize();

	core::vector3df horizontal = up.crossProduct(view);
	if (horizontal.getLength() == 0) {
		horizontal.set(up.Y, up.X, up.Z);
	}
	horizontal.normalize();
	core::vector3df topHorizontal = horizontal * 0.5f * TopEdgeWidth;
	horizontal *= 0.5f * Size.Width;

	// pointing down!
	core::vector3df vertical = horizontal.crossProduct(view);
	vertical.normalize();
	vertical *= 0.5f * Size.Height;

	view *= -1.0f;

	core::array<video::S3DVertex> &vertices = Buffer->Vertices;

	for (s32 i = 0; i < 4; ++i)
		vertices[i].Normal = view;

	/* Vertices are:
	2--1
	|\ |
	| \|
	3--0
	*/
	vertices[0].Pos = pos + horizontal + vertical;
	vertices[1].Pos = pos + topHorizontal - vertical;
	vertices[2].Pos = pos - topHorizontal - vertical;
	vertices[3].Pos = pos - horizontal + vertical;

	Buffer->setDirty(EBT_VERTEX);
	Buffer->recalculateBoundingBox();
}